

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void enterblock(FuncState *fs,BlockCnt *bl,lu_byte isloop)

{
  Dyndata *pDVar1;
  
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  pDVar1 = fs->ls->dyd;
  bl->firstlabel = (short)(pDVar1->label).n;
  bl->firstgoto = (short)(pDVar1->gt).n;
  bl->upval = '\0';
  bl->previous = fs->bl;
  fs->bl = bl;
  return;
}

Assistant:

static void enterblock (FuncState *fs, BlockCnt *bl, lu_byte isloop) {
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  bl->firstlabel = fs->ls->dyd->label.n;
  bl->firstgoto = fs->ls->dyd->gt.n;
  bl->upval = 0;
  bl->previous = fs->bl;
  fs->bl = bl;
  lua_assert(fs->freereg == fs->nactvar);
}